

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

void __thiscall FString::FString(FString *this,char *head,char *tail)

{
  size_t __n;
  size_t __n_00;
  FStringData *pFVar1;
  void *__dest;
  
  __n = strlen(head);
  __n_00 = strlen(tail);
  pFVar1 = FStringData::Alloc(__n_00 + __n);
  this->Chars = (char *)(pFVar1 + 1);
  pFVar1->Len = (uint)(__n_00 + __n);
  memcpy(pFVar1 + 1,head,__n);
  __dest = (void *)((long)&pFVar1[1].Len + __n);
  *(undefined1 *)((long)&pFVar1[1].Len + __n) = 0;
  memcpy(__dest,tail,__n_00);
  *(undefined1 *)(__n_00 + (long)__dest) = 0;
  return;
}

Assistant:

FString::FString (const char *head, const char *tail)
{
	size_t len1 = strlen (head);
	size_t len2 = strlen (tail);
	AllocBuffer (len1 + len2);
	StrCopy (Chars, head, len1);
	StrCopy (Chars + len1, tail, len2);
}